

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_RSAPSS.c
# Opt level: O0

uint64_t check_num_bits_u64(uint32_t bs,uint64_t *b)

{
  uint64_t uVar1;
  long lVar2;
  uint64_t uVar3;
  ulong uVar4;
  undefined8 uStack_80;
  undefined1 auStack_78 [8];
  undefined1 *local_70;
  uint64_t res;
  uint64_t blt;
  uint64_t beq;
  ulong uStack_48;
  uint32_t i;
  uint64_t acc;
  uint32_t j;
  uint32_t i0;
  unsigned_long __vla_expr0;
  uint local_24;
  uint64_t *puStack_20;
  uint32_t bLen;
  uint64_t *b_local;
  ulong uStack_10;
  uint32_t bs_local;
  
  __vla_expr0 = (unsigned_long)auStack_78;
  local_24 = (bs - 1 >> 6) + 1;
  if (bs == local_24 * 0x40) {
    uStack_10 = 0xffffffffffffffff;
  }
  else {
    puStack_20 = b;
    b_local._4_4_ = bs;
    if (0x1fffffffffffffff < (ulong)local_24) {
      uStack_80 = 0x272186;
      printf("Maximum allocatable size exceeded, aborting before overflow at %s:%d\n",
             "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_RSAPSS.c"
             ,0x9f);
      uStack_80 = 0x272190;
      exit(0xfd);
    }
    _j = (ulong)local_24;
    lVar2 = -(_j * 8 + 0xf & 0xfffffffffffffff0);
    uVar4 = (ulong)local_24;
    local_70 = auStack_78 + lVar2;
    *(undefined8 *)(auStack_78 + lVar2 + -8) = 0x2721c9;
    memset(auStack_78 + lVar2,0,uVar4 << 3);
    acc._4_4_ = b_local._4_4_ >> 6;
    acc._0_4_ = b_local._4_4_ & 0x3f;
    *(ulong *)(local_70 + (ulong)acc._4_4_ * 8) =
         *(ulong *)(local_70 + (ulong)acc._4_4_ * 8) | 1L << (sbyte)(uint)acc;
    uStack_48 = 0;
    for (beq._4_4_ = 0; beq._4_4_ < local_24; beq._4_4_ = beq._4_4_ + 1) {
      uVar3 = puStack_20[beq._4_4_];
      uVar1 = *(uint64_t *)(local_70 + (ulong)beq._4_4_ * 8);
      *(undefined8 *)(auStack_78 + lVar2 + -8) = 0x272234;
      blt = FStar_UInt64_eq_mask(uVar3,uVar1);
      uVar3 = puStack_20[beq._4_4_];
      uVar1 = *(uint64_t *)(local_70 + (ulong)beq._4_4_ * 8);
      *(undefined8 *)(auStack_78 + lVar2 + -8) = 0x272256;
      uVar3 = FStar_UInt64_gte_mask(uVar3,uVar1);
      res = uVar3 ^ 0xffffffffffffffff;
      uStack_48 = blt & uStack_48 | (blt ^ 0xffffffffffffffff) & res;
    }
    uStack_10 = uStack_48;
  }
  return uStack_10;
}

Assistant:

static inline uint64_t check_num_bits_u64(uint32_t bs, uint64_t *b)
{
  uint32_t bLen = (bs - 1U) / 64U + 1U;
  if (bs == 64U * bLen)
  {
    return 0xFFFFFFFFFFFFFFFFULL;
  }
  KRML_CHECK_SIZE(sizeof (uint64_t), bLen);
  uint64_t b2[bLen];
  memset(b2, 0U, bLen * sizeof (uint64_t));
  uint32_t i0 = bs / 64U;
  uint32_t j = bs % 64U;
  b2[i0] = b2[i0] | 1ULL << j;
  uint64_t acc = 0ULL;
  for (uint32_t i = 0U; i < bLen; i++)
  {
    uint64_t beq = FStar_UInt64_eq_mask(b[i], b2[i]);
    uint64_t blt = ~FStar_UInt64_gte_mask(b[i], b2[i]);
    acc = (beq & acc) | (~beq & ((blt & 0xFFFFFFFFFFFFFFFFULL) | (~blt & 0ULL)));
  }
  uint64_t res = acc;
  return res;
}